

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

iterator __thiscall
cs::tree_type<cs::token_base*>::emplace_root_left<cs::token_value*>
          (tree_type<cs::token_base_*> *this,iterator it,token_value **args)

{
  bool bVar1;
  tree_node *this_00;
  error *this_01;
  tree_node *ptr;
  token_value **in_RDX;
  tree_node *in_RSI;
  long *in_RDI;
  tree_node *node;
  string *in_stack_ffffffffffffff78;
  allocator local_51;
  string local_50 [48];
  token_value **local_20;
  iterator local_10;
  iterator local_8;
  
  local_20 = in_RDX;
  if (in_RSI == (tree_node *)*in_RDI) {
    this_00 = (tree_node *)operator_new(0x20);
    tree_node::tree_node<cs::token_value*>
              (this_00,(tree_node *)0x0,(tree_node *)*in_RDI,(tree_node *)0x0,local_20);
    *in_RDI = (long)this_00;
    tree_type<cs::token_base_*>::iterator::iterator(&local_8,(tree_node *)*in_RDI);
  }
  else {
    local_10.mData = in_RSI;
    bVar1 = tree_type<cs::token_base_*>::iterator::usable(&local_10);
    if (!bVar1) {
      this_01 = (error *)__cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"E000E",&local_51);
      cov::error::error(this_01,in_stack_ffffffffffffff78);
      __cxa_throw(this_01,&cov::error::typeinfo,cov::error::~error);
    }
    ptr = (tree_node *)operator_new(0x20);
    tree_node::tree_node<cs::token_value*>
              ((tree_node *)ptr,(local_10.mData)->root,local_10.mData,(tree_node *)0x0,local_20);
    if ((local_10.mData)->root->left == local_10.mData) {
      (local_10.mData)->root->left = ptr;
    }
    else {
      (local_10.mData)->root->right = ptr;
    }
    (local_10.mData)->root = ptr;
    tree_type<cs::token_base_*>::iterator::iterator(&local_8,ptr);
  }
  return (iterator)local_8.mData;
}

Assistant:

iterator emplace_root_left(iterator it, Args &&...args)
		{
			if (it.mData == mRoot) {
				mRoot = new tree_node(nullptr, mRoot, nullptr, std::forward<Args>(args)...);
				return mRoot;
			}
			if (!it.usable())
				throw cov::error("E000E");
			tree_node *node = new tree_node(it.mData->root, it.mData, nullptr, std::forward<Args>(args)...);
			if (it.mData->root->left == it.mData)
				it.mData->root->left = node;
			else
				it.mData->root->right = node;
			it.mData->root = node;
			return node;
		}